

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

pair<unsigned_long,_unsigned_long>
absl::lts_20250127::hash_internal::MixingHashState::Read9To16(uchar *p,size_t len)

{
  uint64_t local_48;
  uint64_t least_significant;
  uint64_t most_significant;
  uint64_t high_mem;
  uint64_t low_mem;
  size_t len_local;
  uchar *p_local;
  
  low_mem = len;
  len_local = (size_t)p;
  high_mem = Read8(p);
  least_significant = Read8((uchar *)((len_local - 8) + low_mem));
  local_48 = high_mem;
  most_significant = least_significant;
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
            ((pair<unsigned_long,_unsigned_long> *)&p_local,&local_48,&least_significant);
  return _p_local;
}

Assistant:

static std::pair<uint64_t, uint64_t> Read9To16(const unsigned char* p,
                                                 size_t len) {
    uint64_t low_mem = Read8(p);
    uint64_t high_mem = Read8(p + len - 8);
#ifdef ABSL_IS_LITTLE_ENDIAN
    uint64_t most_significant = high_mem;
    uint64_t least_significant = low_mem;
#else
    uint64_t most_significant = low_mem;
    uint64_t least_significant = high_mem;
#endif
    return {least_significant, most_significant};
  }